

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O2

void __thiscall Assembler::printCodeBySection(Assembler *this)

{
  _Base_ptr p_Var1;
  long lVar2;
  ostream *poVar3;
  _Base_ptr p_Var4;
  uint uVar5;
  char *byte;
  _Base_ptr p_Var6;
  ofstream file;
  undefined8 uStack_220;
  uint auStack_218 [122];
  
  std::ofstream::ofstream((ostream *)&file,(string *)&this->outputFileName,_S_app);
  poVar3 = std::operator<<((ostream *)&file,"Code:");
  poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  for (p_Var4 = (this->codeBySection)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->codeBySection)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    if (*(_Base_ptr *)(p_Var4 + 2) != p_Var4[2]._M_parent) {
      poVar3 = std::operator<<((ostream *)&file,"section name: ");
      poVar3 = std::operator<<(poVar3,(string *)(p_Var4 + 1));
      poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
      std::endl<char,std::char_traits<char>>(poVar3);
      p_Var6 = *(_Base_ptr *)(p_Var4 + 2);
      p_Var1 = p_Var4[2]._M_parent;
      while( true ) {
        lVar2 = *(long *)(_file + -0x18);
        uVar5 = *(uint *)((long)auStack_218 + lVar2) & 0xffffffb5;
        if (p_Var6 == p_Var1) break;
        *(uint *)((long)auStack_218 + lVar2) = uVar5 | 8;
        *(undefined8 *)((long)&uStack_220 + *(long *)(_file + -0x18)) = 2;
        poVar3 = std::operator<<((ostream *)&file,0x30);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)(byte)(char)p_Var6->_M_color);
        std::operator<<(poVar3,"\t");
        p_Var6 = (_Base_ptr)((long)&p_Var6->_M_color + 1);
      }
      *(uint *)((long)auStack_218 + lVar2) = uVar5 | 2;
      poVar3 = std::endl<char,std::char_traits<char>>((ostream *)&file);
      std::endl<char,std::char_traits<char>>(poVar3);
    }
  }
  std::ofstream::~ofstream(&file);
  return;
}

Assistant:

void Assembler::printCodeBySection() {
    ofstream file(this->outputFileName, ios::app);

    file << "Code:" << endl << endl;

    for (auto &oneSection: codeBySection) {
        if (oneSection.second.empty()) continue;
        file << "section name: " << oneSection.first << endl << endl;

        for (const auto &byte: oneSection.second) {

            file << hex << setw(2) << setfill('0') << (((int) byte) & 0xFF) << "\t";


        }
        file << dec << endl << endl;

    }
}